

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::emit_marker(jpeg_encoder *this,int marker)

{
  emit_byte(this,0xff);
  emit_byte(this,(uint8)marker);
  return;
}

Assistant:

void jpeg_encoder::emit_marker(int marker)
{
  emit_byte(uint8(0xFF)); emit_byte(uint8(marker));
}